

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

Data * __thiscall Runtime::getVar(Runtime *this,string *name)

{
  Data *pDVar1;
  _Fwd_list_node_base *p_Var2;
  
  p_Var2 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head
           ._M_next;
  do {
    if ((VarEnv *)p_Var2[1]._M_next == (VarEnv *)0x0) {
      p_Var2 = p_Var2->_M_next;
      pDVar1 = (Data *)0x0;
    }
    else {
      pDVar1 = VarEnv::getVar((VarEnv *)p_Var2[1]._M_next,name);
    }
  } while (pDVar1 == (Data *)0x0);
  return pDVar1;
}

Assistant:

Data *Runtime::getVar(std::string &name) {
    auto cursor = varEnvs.begin();
    Data *result = NULL;
    while (result == NULL) {
        if ((*cursor) == NULL) {
            cursor++;
        } else {
            result = (*cursor)->getVar(name);
        }
    }
    return result;
}